

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  bool bVar1;
  undefined1 uVar2;
  char cVar3;
  ImGuiTableColumn *pIVar4;
  long lVar5;
  int i;
  short sVar6;
  ImGuiTableColumnSortSpecs *pIVar7;
  
  bVar1 = table->IsSortSpecsDirty;
  if (bVar1 == true) {
    TableSortSpecsSanitize(table);
    uVar2 = table->SortSpecsCount;
    cVar3 = '\0';
    if ('\x01' < (char)uVar2) {
      cVar3 = uVar2;
    }
    ImVector<ImGuiTableColumnSortSpecs>::resize(&table->SortSpecsMulti,(int)cVar3);
    (table->SortSpecs).SpecsDirty = true;
    table->IsSortSpecsDirty = false;
  }
  cVar3 = table->SortSpecsCount;
  if (cVar3 == '\0') {
    pIVar7 = (ImGuiTableColumnSortSpecs *)0x0;
  }
  else {
    if (cVar3 == '\x01') {
      pIVar7 = &table->SortSpecsSingle;
    }
    else {
      pIVar7 = (table->SortSpecsMulti).Data;
    }
    if ((bVar1 & pIVar7 != (ImGuiTableColumnSortSpecs *)0x0) == 1) {
      sVar6 = 0;
      for (i = 0; i < table->ColumnsCount; i = i + 1) {
        pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i);
        cVar3 = pIVar4->SortOrder;
        lVar5 = (long)cVar3;
        if (lVar5 != -1) {
          if (table->SortSpecsCount <= cVar3) {
            __assert_fail("column->SortOrder < table->SortSpecsCount",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                          ,0xad2,"void ImGui::TableSortSpecsBuild(ImGuiTable *)");
          }
          pIVar7[lVar5].ColumnUserID = pIVar4->UserID;
          pIVar7[lVar5].ColumnIndex = (short)(char)((ushort)sVar6 >> 8);
          pIVar7[lVar5].SortOrder = (short)cVar3;
          pIVar7[lVar5].field_0x8 = pIVar4->field_0x65 & 3;
        }
        sVar6 = sVar6 + 0x100;
      }
      cVar3 = table->SortSpecsCount;
    }
  }
  (table->SortSpecs).Specs = pIVar7;
  (table->SortSpecs).SpecsCount = (int)cVar3;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    bool dirty = table->IsSortSpecsDirty;
    if (dirty)
    {
        TableSortSpecsSanitize(table);
        table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
        table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
        table->IsSortSpecsDirty = false; // Mark as not dirty for us
    }

    // Write output
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    if (dirty && sort_specs != NULL)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->SortOrder == -1)
                continue;
            IM_ASSERT(column->SortOrder < table->SortSpecsCount);
            ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
            sort_spec->ColumnUserID = column->UserID;
            sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
            sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
            sort_spec->SortDirection = column->SortDirection;
        }

    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
}